

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es3fFboTestUtil.cpp
# Opt level: O3

void __thiscall
deqp::gles3::Functional::FboTestUtil::TextureCubeShader::shadeFragments
          (TextureCubeShader *this,FragmentPacket *packets,int numPackets,
          FragmentShadingContext *context)

{
  DataType DVar1;
  pointer pUVar2;
  GenericVec4 *pGVar3;
  TextureCubeShader *pTVar4;
  int iVar5;
  long lVar6;
  int iVar7;
  float *pfVar8;
  int fragNdx;
  long lVar9;
  FragmentPacket *packet;
  float fVar10;
  float fVar11;
  float fVar12;
  float fVar13;
  Vec4 coord;
  UVec4 uicolor;
  IVec4 icolor;
  Vec3 texCoords [4];
  Vec4 colors [4];
  float local_128;
  float fStack_124;
  float fStack_120;
  float fStack_11c;
  ulong local_110;
  TextureCubeShader *local_108;
  FragmentPacket *local_100;
  TextureCube *local_f8;
  ulong local_f0;
  undefined8 local_e8;
  undefined8 uStack_e0;
  undefined8 local_d8;
  undefined8 uStack_d0;
  float local_c8;
  float fStack_c4;
  float fStack_c0;
  float fStack_bc;
  float local_b8;
  float fStack_b4;
  float fStack_b0;
  float fStack_ac;
  undefined1 local_a8 [16];
  undefined8 local_98;
  undefined8 uStack_90;
  undefined8 local_88;
  undefined8 uStack_80;
  Vec4 local_78;
  undefined8 local_68;
  undefined8 uStack_60;
  undefined8 local_58;
  undefined8 uStack_50;
  undefined8 local_48;
  undefined8 uStack_40;
  
  pUVar2 = (this->super_ShaderProgram).m_uniforms.
           super__Vector_base<sglr::UniformSlot,_std::allocator<sglr::UniformSlot>_>._M_impl.
           super__Vector_impl_data._M_start;
  local_d8 = *(undefined8 *)&pUVar2[2].value;
  uStack_d0 = *(undefined8 *)((long)&pUVar2[2].value + 8);
  local_e8 = *(undefined8 *)&pUVar2[3].value;
  uStack_e0 = *(undefined8 *)((long)&pUVar2[3].value + 8);
  local_88 = 0;
  uStack_80 = 0;
  local_98 = 0;
  uStack_90 = 0;
  local_a8._0_4_ = 0.0;
  local_a8._4_4_ = 0.0;
  local_a8._8_8_ = 0;
  local_48 = 0;
  uStack_40 = 0;
  local_58 = 0;
  uStack_50 = 0;
  local_68 = 0;
  uStack_60 = 0;
  local_78.m_data[0] = 0.0;
  local_78.m_data[1] = 0.0;
  local_78.m_data[2] = 0.0;
  local_78.m_data[3] = 0.0;
  if (0 < numPackets) {
    local_110 = (ulong)(uint)numPackets;
    iVar5 = 0;
    local_f0 = 0;
    local_108 = this;
    local_100 = packets;
    do {
      pTVar4 = local_108;
      local_f8 = (local_108->super_ShaderProgram).m_uniforms.
                 super__Vector_base<sglr::UniformSlot,_std::allocator<sglr::UniformSlot>_>._M_impl.
                 super__Vector_impl_data._M_start[1].sampler.texCube;
      packet = local_100 + local_f0;
      pfVar8 = (float *)(local_a8 + 8);
      lVar9 = 0;
      do {
        rr::readTriangleVarying<float>((rr *)&local_128,packet,context,0,(int)lVar9);
        *(ulong *)(pfVar8 + -2) = CONCAT44(fStack_124,local_128);
        *pfVar8 = fStack_120;
        lVar9 = lVar9 + 1;
        pfVar8 = pfVar8 + 3;
      } while (lVar9 != 4);
      sglr::rc::TextureCube::sample4(local_f8,&local_78,(Vec3 *)local_a8,0.0);
      DVar1 = pTVar4->m_outputType;
      pGVar3 = context->outputArray;
      lVar9 = 0;
      iVar7 = iVar5;
      do {
        local_128 = *(float *)((long)local_78.m_data + lVar9) * (float)local_d8 + (float)local_e8;
        fStack_124 = *(float *)((long)local_78.m_data + lVar9 + 4) * local_d8._4_4_ + local_e8._4_4_
        ;
        fStack_120 = *(float *)((long)local_78.m_data + lVar9 + 8) * (float)uStack_d0 +
                     (float)uStack_e0;
        fStack_11c = *(float *)((long)local_78.m_data + lVar9 + 0xc) * uStack_d0._4_4_ +
                     uStack_e0._4_4_;
        castVectorSaturate<int>((Vec4 *)&local_128);
        castVectorSaturate<unsigned_int>((Vec4 *)&local_128);
        if (DVar1 == TYPE_UINT_VEC4) {
          lVar6 = (long)(context->numFragmentOutputs * iVar7) << 4;
          fVar10 = local_c8;
          fVar11 = fStack_c4;
          fVar12 = fStack_c0;
          fVar13 = fStack_bc;
LAB_0069d0f2:
          pfVar8 = (float *)((long)&pGVar3->v + lVar6);
          *pfVar8 = fVar10;
          pfVar8[1] = fVar11;
          pfVar8[2] = fVar12;
          pfVar8[3] = fVar13;
        }
        else {
          if (DVar1 == TYPE_INT_VEC4) {
            lVar6 = (long)(context->numFragmentOutputs * iVar7) << 4;
            fVar10 = local_b8;
            fVar11 = fStack_b4;
            fVar12 = fStack_b0;
            fVar13 = fStack_ac;
            goto LAB_0069d0f2;
          }
          if (DVar1 == TYPE_FLOAT_VEC4) {
            lVar6 = (long)(context->numFragmentOutputs * iVar7) << 4;
            fVar10 = local_128;
            fVar11 = fStack_124;
            fVar12 = fStack_120;
            fVar13 = fStack_11c;
            goto LAB_0069d0f2;
          }
        }
        lVar9 = lVar9 + 0x10;
        iVar7 = iVar7 + 1;
      } while (lVar9 != 0x40);
      local_f0 = local_f0 + 1;
      iVar5 = iVar5 + 4;
    } while (local_f0 != local_110);
  }
  return;
}

Assistant:

void TextureCubeShader::shadeFragments (rr::FragmentPacket* packets, const int numPackets, const rr::FragmentShadingContext& context) const
{
	const tcu::Vec4 texScale (m_uniforms[2].value.f4);
	const tcu::Vec4 texBias	 (m_uniforms[3].value.f4);

	tcu::Vec3 texCoords[4];
	tcu::Vec4 colors[4];

	for (int packetNdx = 0; packetNdx < numPackets; ++packetNdx)
	{
		const sglr::rc::TextureCube* tex = m_uniforms[1].sampler.texCube;

		for (int fragNdx = 0; fragNdx < 4; ++fragNdx)
		{
			const tcu::Vec4	coord = rr::readTriangleVarying<float>(packets[packetNdx], context, 0, fragNdx);
			texCoords[fragNdx] = tcu::Vec3(coord.x(), coord.y(), coord.z());
		}

		tex->sample4(colors, texCoords);

		for (int fragNdx = 0; fragNdx < 4; ++fragNdx)
		{
			const tcu::Vec4		color	= colors[fragNdx] * texScale + texBias;
			const tcu::IVec4	icolor	= castVectorSaturate<deInt32>(color);
			const tcu::UVec4	uicolor	= castVectorSaturate<deUint32>(color);

			if (m_outputType == glu::TYPE_FLOAT_VEC4)			rr::writeFragmentOutput(context, packetNdx, fragNdx, 0, color);
			else if (m_outputType == glu::TYPE_INT_VEC4)		rr::writeFragmentOutput(context, packetNdx, fragNdx, 0, icolor);
			else if (m_outputType == glu::TYPE_UINT_VEC4)		rr::writeFragmentOutput(context, packetNdx, fragNdx, 0, uicolor);
			else
				DE_ASSERT(DE_FALSE);
		}
	}
}